

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
Test_Template_FailedInitWithAutoEscape::Test_Template_FailedInitWithAutoEscape
          (Test_Template_FailedInitWithAutoEscape *this)

{
  value_type local_18;
  Test_Template_FailedInitWithAutoEscape *local_10;
  Test_Template_FailedInitWithAutoEscape *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, FailedInitWithAutoEscape) {
  Strip strip = STRIP_WHITESPACE;
  // Taken from HTML Parser test suite.
  string bad_html = "<a href='http://www.google.com' ''>\n";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));

  // Missing quotes around URL, not accepted in URL-taking attributes.
  bad_html = "<a href={{URL}}>bla</a>";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));

  // Missing quotes around STYLE, not accepted in style-taking attributes.
  bad_html = "<div style={{STYLE}}>";
  ASSERT(NULL == StringToTemplateWithAutoEscaping(bad_html, strip, TC_HTML));
}